

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

bool __thiscall
binlog::SessionWriter::
addEvent<unsigned_long_long&,unsigned_long_long_const&,unsigned_long_long_const&,unsigned_long_long>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,unsigned_long_long *args,
          unsigned_long_long *args_1,unsigned_long_long *args_2,unsigned_long_long *args_3)

{
  ulong minQueueCapacity;
  Queue *pQVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  size_t sizes [6];
  long local_68 [7];
  
  local_68[0] = 8;
  local_68[1] = 8;
  local_68[2] = 8;
  local_68[3] = 8;
  local_68[4] = 8;
  local_68[5] = 8;
  lVar5 = 0;
  lVar6 = 0;
  lVar2 = 0;
  do {
    lVar5 = lVar5 + local_68[lVar2];
    lVar6 = lVar6 + local_68[lVar2 + 1];
    lVar2 = lVar2 + 2;
  } while (lVar2 != 6);
  minQueueCapacity = lVar6 + lVar5 + 4;
  if ((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity) {
    sVar3 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw);
    if (((sVar3 < minQueueCapacity) &&
        (replaceChannel(this,minQueueCapacity),
        (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity)) &&
       (sVar3 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw), sVar3 < minQueueCapacity)) {
      return false;
    }
  }
  *(int *)(this->_qw)._writePos = (int)(lVar6 + lVar5);
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 4;
  *(uint64_t *)(pcVar4 + 4) = eventSourceId;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 8;
  *(uint64_t *)(pcVar4 + 8) = clock;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 8;
  *(unsigned_long_long *)(pcVar4 + 8) = *args;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 8;
  *(unsigned_long_long *)(pcVar4 + 8) = *args_1;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 8;
  *(unsigned_long_long *)(pcVar4 + 8) = *args_2;
  pcVar4 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar4 + 8;
  *(unsigned_long_long *)(pcVar4 + 8) = *args_3;
  pQVar1 = (this->_qw)._queue;
  pcVar4 = (this->_qw)._writePos + 8;
  (this->_qw)._writePos = pcVar4;
  (pQVar1->writeIndex).super___atomic_base<unsigned_long>._M_i = (long)pcVar4 - (long)pQVar1->buffer
  ;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}